

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O1

void TPZShapeHCurlNoGrads<pzshape::TPZShapeLinear>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *curlphi)

{
  long lVar1;
  int iVar2;
  long lVar3;
  TPZVec<double> *pTVar4;
  ulong uVar5;
  TPZManVector<int,_1> first_hcurl_side;
  TPZFMatrix<double> curlphi_unfilt;
  TPZFMatrix<double> phi_unfilt;
  TPZVec<int> local_190;
  int local_170 [2];
  _func_int **local_168;
  TPZVec<double> *local_160;
  uint local_154;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  local_160 = pt;
  local_154 = pztopology::TPZLine::NumSides(1);
  TPZVec<int>::TPZVec(&local_190,0);
  local_190._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e5270;
  local_190.fStore = local_170;
  local_190.fNElements = 1;
  local_190.fNAlloc = 0;
  local_170[0] = 0;
  iVar2 = TPZShapeHCurl<pzshape::TPZShapeLinear>::ComputeNConnectShapeF
                    (0,*(data->fHDivConnectOrders).super_TPZVec<int>.fStore);
  lVar3 = (long)iVar2;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_c0.fElem = (double *)0x0;
  local_c0.fGiven = (double *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar3;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_168 = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_c0.fWork.fStore = (double *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  if (iVar2 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar2) {
      uVar5 = lVar3 * 8;
    }
    local_c0.fElem = (double *)operator_new__(uVar5);
  }
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183c898;
  local_150.fElem = (double *)0x0;
  local_150.fGiven = (double *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar3;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = local_168;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_150.fWork.fStore = (double *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  if (iVar2 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar2) {
      uVar5 = lVar3 << 3;
    }
    local_150.fElem = (double *)operator_new__(uVar5);
  }
  TPZShapeHCurl<pzshape::TPZShapeLinear>::Shape(local_160,data,&local_c0,&local_150);
  if (0 < (int)local_154) {
    local_160 = (TPZVec<double> *)(ulong)local_154;
    pTVar4 = (TPZVec<double> *)0x0;
    do {
      iVar2 = local_190.fStore[(long)pTVar4];
      lVar3 = (long)iVar2;
      if (((local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) || (iVar2 < 0)) ||
         (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = lVar3 + 1;
      if (((local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) || (iVar2 < -1)) ||
         (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)pTVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * (long)pTVar4] =
           local_c0.fElem[local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar3] +
           local_c0.fElem[local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar1];
      if ((local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
         ((iVar2 < 0 || (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar3)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
         ((iVar2 < -1 || (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar1)))) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)pTVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      curlphi->fElem[(curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * (long)pTVar4] =
           local_150.fElem[lVar3 * local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] +
           local_150.fElem[lVar1 * local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow];
      pTVar4 = (TPZVec<double> *)((long)&pTVar4->_vptr_TPZVec + 1);
    } while (local_160 != pTVar4);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  if (local_190.fStore == local_170) {
    local_190.fStore = (int *)0x0;
  }
  local_190.fNAlloc = 0;
  local_190._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_190.fStore != (int *)0x0) {
    operator_delete__(local_190.fStore);
  }
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &curlphi)
{

    constexpr int ncorner = TSHAPE::NCornerNodes;
    constexpr int nsides = TSHAPE::NSides;
    constexpr int ncon = nsides - ncorner;
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nedges = TSHAPE::NumSides(1);
    
    //calculates # of unfiltered hcurl functions
    const auto &connectorders = data.fHDivConnectOrders;
    //first_hcurl_side[i] is the index of the first shape function associated with side i
    TPZManVector<int,ncon> first_hcurl_side(ncon,0);
    //total number of unfiltered funcs
    int n_unfilt = 0;

    {
      n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(0,connectorders[0]);
      for (int i = 1; i < ncon; i++){
        first_hcurl_side[i] = n_unfilt;
        n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(i,connectorders[i]);
      }
    }
    
    //computes  unfiltered hcurl funcs
    TPZFMatrix<REAL> phi_unfilt(dim,n_unfilt), curlphi_unfilt(curldim,n_unfilt);
    TPZShapeHCurl<TSHAPE>::Shape(pt, data, phi_unfilt, curlphi_unfilt);

    //now we filter the functions
    int fcount = 0;
    //edges: we sum the lowest order functions on the edge
    for(auto ie = 0; ie < nedges; ie++){
      //fss = first side shape
      const auto fss = first_hcurl_side[ie];
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fss) + phi_unfilt(x,fss+1);
      }
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fss) + curlphi_unfilt(x,fss+1);
      }
      fcount++;
    }
    if constexpr (dim < 2) return;

    TPZVec<int> filtVecShape;
    HighOrderFunctionsFilter(first_hcurl_side, connectorders,filtVecShape);

    const auto newfuncs = filtVecShape.size();
    
    for(int ifunc = 0; ifunc < newfuncs; ifunc++){
      const auto fi = filtVecShape[ifunc];
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fi);
      }
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fi);
      }
      fcount++;
    } 
    
    
}